

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Block * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::Block>
                  (Arena *arena)

{
  Block *pBVar1;
  
  if (arena != (Arena *)0x0) {
    pBVar1 = DoCreateMessage<CoreML::Specification::MILSpec::Block>(arena);
    return pBVar1;
  }
  pBVar1 = (Block *)operator_new(0x90);
  CoreML::Specification::MILSpec::Block::Block(pBVar1,(Arena *)0x0,false);
  return pBVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }